

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O0

void __thiscall
World_3df::breed(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  type pFVar1;
  type pPVar2;
  creat_t *pcVar3;
  size_type sVar4;
  const_reference pvVar5;
  type pCVar6;
  double dVar7;
  Msg local_4c8;
  undefined1 local_498 [24];
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  Msg local_370;
  Msg local_340;
  Msg local_310;
  Msg local_2e0;
  Msg local_2b0;
  Msg local_280;
  Msg local_250;
  Msg local_220;
  Msg local_1f0;
  Msg local_1c0;
  Msg local_190;
  Msg local_160;
  Msg local_130;
  Msg local_100;
  Msg local_d0;
  undefined1 local_a0 [24];
  size_t xpnt;
  double m2;
  double m1;
  size_t i;
  shared_ptr<Population> *local_20;
  shared_ptr<Population> *dst_local;
  shared_ptr<Population> *param_1_local;
  World_3df *this_local;
  
  local_20 = dst;
  dst_local = param_1;
  param_1_local = (shared_ptr<Population> *)this;
  World::get_log((World *)&stack0xffffffffffffffd0);
  pFVar1 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&stack0xffffffffffffffd0);
  util::logging::Msg::Msg((Msg *)&stack0xffffffffffffffa0,anon_var_dwarf_2ac4e,L_NORM);
  (*(pFVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar1,&stack0xffffffffffffffa0);
  util::logging::Msg::~Msg((Msg *)&stack0xffffffffffffffa0);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)&stack0xffffffffffffffd0);
  pPVar2 = boost::shared_ptr<Population>::operator->(local_20);
  m1 = (double)pPVar2->ELITE_SIZE;
  while( true ) {
    dVar7 = m1;
    pPVar2 = boost::shared_ptr<Population>::operator->(local_20);
    pcVar3 = Population::get_creatures(pPVar2);
    sVar4 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
            ::size(pcVar3);
    if (sVar4 - 1 <= (ulong)dVar7) break;
    pPVar2 = boost::shared_ptr<Population>::operator->(local_20);
    pcVar3 = Population::get_creatures(pPVar2);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[](pcVar3,(size_type)m1);
    pCVar6 = boost::shared_ptr<Creature>::operator->(pvVar5);
    m2 = Creature::get_fitness(pCVar6);
    pPVar2 = boost::shared_ptr<Population>::operator->(local_20);
    pcVar3 = Population::get_creatures(pPVar2);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[](pcVar3,(long)m1 + 1);
    pCVar6 = boost::shared_ptr<Creature>::operator->(pvVar5);
    xpnt = (size_t)Creature::get_fitness(pCVar6);
    local_a0._16_8_ = frand(0x31);
    pPVar2 = boost::shared_ptr<Population>::operator->(local_20);
    (*pPVar2->_vptr_Population[3])(pPVar2,m1,(long)m1 + 1,local_a0._16_8_);
    World::get_log((World *)local_a0);
    pFVar1 = boost::shared_ptr<util::logging::File_logger>::operator*
                       ((shared_ptr<util::logging::File_logger> *)local_a0);
    util::logging::Msg::Msg(&local_370,"... [",L_NORM);
    util::logging::Msg::operator+(&local_340,&local_370,(longlong)m1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"]x[",&local_391);
    util::logging::Msg::operator+(&local_310,&local_340,(string *)local_390);
    util::logging::Msg::operator+(&local_2e0,&local_310,(long)m1 + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"]@",&local_3b9);
    util::logging::Msg::operator+(&local_2b0,&local_2e0,(string *)local_3b8);
    util::logging::Msg::operator+(&local_280,&local_2b0,local_a0._16_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0," = {f1: ",&local_3e1);
    util::logging::Msg::operator+(&local_250,&local_280,(string *)local_3e0);
    util::logging::Msg::operator+(&local_220,&local_250,m2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_408," -> ",&local_409);
    util::logging::Msg::operator+(&local_1f0,&local_220,(string *)local_408);
    pPVar2 = boost::shared_ptr<Population>::operator->(local_20);
    pcVar3 = Population::get_creatures(pPVar2);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[](pcVar3,(size_type)m1);
    pCVar6 = boost::shared_ptr<Creature>::operator->(pvVar5);
    dVar7 = Creature::get_fitness(pCVar6);
    util::logging::Msg::operator+(&local_1c0,&local_1f0,dVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"}x{f2: ",&local_431);
    util::logging::Msg::operator+(&local_190,&local_1c0,(string *)local_430);
    util::logging::Msg::operator+(&local_160,&local_190,(double)xpnt);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458," -> ",&local_459);
    util::logging::Msg::operator+(&local_130,&local_160,(string *)local_458);
    pPVar2 = boost::shared_ptr<Population>::operator->(local_20);
    pcVar3 = Population::get_creatures(pPVar2);
    pvVar5 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[](pcVar3,(long)m1 + 1);
    pCVar6 = boost::shared_ptr<Creature>::operator->(pvVar5);
    dVar7 = Creature::get_fitness(pCVar6);
    util::logging::Msg::operator+(&local_100,&local_130,dVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"}",(allocator *)(local_498 + 0x17));
    util::logging::Msg::operator+(&local_d0,&local_100,(string *)local_480);
    (*(pFVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar1,&local_d0);
    util::logging::Msg::~Msg(&local_d0);
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)(local_498 + 0x17));
    util::logging::Msg::~Msg(&local_100);
    util::logging::Msg::~Msg(&local_130);
    std::__cxx11::string::~string(local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    util::logging::Msg::~Msg(&local_160);
    util::logging::Msg::~Msg(&local_190);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    util::logging::Msg::~Msg(&local_1c0);
    util::logging::Msg::~Msg(&local_1f0);
    std::__cxx11::string::~string(local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    util::logging::Msg::~Msg(&local_220);
    util::logging::Msg::~Msg(&local_250);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    util::logging::Msg::~Msg(&local_280);
    util::logging::Msg::~Msg(&local_2b0);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    util::logging::Msg::~Msg(&local_2e0);
    util::logging::Msg::~Msg(&local_310);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    util::logging::Msg::~Msg(&local_340);
    util::logging::Msg::~Msg(&local_370);
    boost::shared_ptr<util::logging::File_logger>::~shared_ptr
              ((shared_ptr<util::logging::File_logger> *)local_a0);
    m1 = (double)((long)m1 + 2);
  }
  World::get_log((World *)local_498);
  pFVar1 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)local_498);
  util::logging::Msg::Msg(&local_4c8,anon_var_dwarf_2ac38,L_NORM);
  (*(pFVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar1,&local_4c8);
  util::logging::Msg::~Msg(&local_4c8);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)local_498);
  return;
}

Assistant:

void World_3df::breed( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{

	(*get_log()) << "Krzyżowanie...";

	/*
	 * First  ELITE_SIZE is elite, so we live it alone
	 *
	 * If crits count isn't even, we leave one out
	 */
	size_t i = dst->ELITE_SIZE;
	while(i < (dst->get_creatures().size() - 1))
	{
		double m1 = dst->get_creatures()[i]->get_fitness(), m2 = dst->get_creatures()[i + 1]->get_fitness();
		size_t xpnt = frand(CHROMSIZE - 1);
		dst->breed_creatures(i, i + 1, xpnt);

		(*get_log()) << util::logging::Msg("... [") + static_cast<long long> (i) + "]x[" + static_cast<long long> (i
				+ 1) + "]@" + static_cast<long long> (xpnt) + " = {f1: " + m1 + " -> "
				+ dst->get_creatures()[i]->get_fitness() + "}x{f2: " + m2 + " -> "
				+ dst->get_creatures()[i + 1]->get_fitness() + "}";
		i += 2;
	}

	(*get_log()) << "Już";
}